

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O1

void __thiscall TeamCityTestOutput::printCurrentTestEnded(TeamCityTestOutput *this,TestResult *res)

{
  char *s;
  size_t sVar1;
  
  if (this->currtest_ != (UtestShell *)0x0) {
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])
              (this,"##teamcity[testFinished name=\'");
    UtestShell::getName((UtestShell *)&stack0xffffffffffffffd8);
    s = SimpleString::asCharString((SimpleString *)&stack0xffffffffffffffd8);
    printEscaped(this,s);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd8);
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"\' duration=\'")
    ;
    sVar1 = TestResult::getCurrentTestTotalExecutionTime(res);
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xd])(this,sVar1);
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"\']\n");
  }
  return;
}

Assistant:

void TeamCityTestOutput::printCurrentTestEnded(const TestResult& res)
{
    if (!currtest_)
        return;

    print("##teamcity[testFinished name='");
    printEscaped(currtest_->getName().asCharString());
    print("' duration='");
    print(res.getCurrentTestTotalExecutionTime());
    print("']\n");
}